

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O0

void nn_ep_stopped(nn_ep *self)

{
  nn_fsm_event *in_RDI;
  
  *(nn_fsm_event **)&in_RDI[1].src = in_RDI;
  *(undefined4 *)&in_RDI[1].srcptr = 0xfffffffe;
  *(undefined8 *)&in_RDI[1].type = 0;
  *(undefined4 *)&in_RDI[1].item.next = 1;
  nn_ctx_raise((nn_ctx *)self,in_RDI);
  return;
}

Assistant:

void nn_ep_stopped (struct nn_ep *self)
{
    /*  TODO: Do the following in a more sane way. */
    self->fsm.stopped.fsm = &self->fsm;
    self->fsm.stopped.src = NN_FSM_ACTION;
    self->fsm.stopped.srcptr = NULL;
    self->fsm.stopped.type = NN_EP_ACTION_STOPPED;
    nn_ctx_raise (self->fsm.ctx, &self->fsm.stopped);
}